

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_auth.c
# Opt level: O1

ssize_t tnt_auth_raw(tnt_stream *s,char *user,int ulen,char *pass,int plen,char *base64_salt)

{
  SHA1_CTX *context;
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ssize_t sVar5;
  char cVar6;
  ulong uVar7;
  bool bVar8;
  uchar local_208 [8];
  char salt [64];
  uchar hash2 [20];
  char len_prefix [9];
  byte local_158 [8];
  uchar hash1 [20];
  byte local_138 [8];
  char scramble [20];
  undefined2 local_118;
  byte local_116;
  undefined1 auStack_115 [2];
  undefined1 auStack_113 [3];
  char body [64];
  iovec v [6];
  undefined4 uStack_68;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  tnt_iheader hdr;
  
  if (user == (char *)0x0) {
    bVar8 = true;
  }
  else if (ulen == 5) {
    iVar1 = strncmp(user,"guest",5);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  if (bVar8) {
    user = "guest";
    ulen = 5;
  }
  uVar4 = s->reqid;
  s->reqid = uVar4 + 1;
  cStack_63 = '\0';
  cStack_62 = '\0';
  cStack_61 = '\0';
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  uStack_68 = 0x1070082;
  cVar6 = (char)uVar4;
  if (uVar4 < 0x80) {
    hdr._24_8_ = &cStack_63;
    cStack_64 = cVar6;
    v[1].iov_base = (void *)0x5;
  }
  else if (uVar4 < 0x100) {
    hdr._24_8_ = &cStack_62;
    cStack_64 = -0x34;
    cStack_63 = cVar6;
    v[1].iov_base = (void *)0x6;
  }
  else {
    cStack_63 = (char)(uVar4 >> 8);
    if (uVar4 < 0x10000) {
      hdr._24_8_ = &cStack_61;
      cStack_64 = -0x33;
      v[1].iov_base = (void *)0x7;
      cStack_62 = cVar6;
    }
    else if (uVar4 >> 0x20 == 0) {
      hdr._24_8_ = hdr.header + 1;
      cStack_64 = -0x32;
      cStack_62 = (char)(uVar4 >> 0x10);
      cStack_61 = cStack_63;
      cStack_63 = (char)(uVar4 >> 0x18);
      v[1].iov_base = (void *)0x9;
      hdr.header[0] = cVar6;
    }
    else {
      hdr._24_8_ = hdr.header + 5;
      cStack_64 = -0x31;
      cStack_62 = (char)(uVar4 >> 0x30);
      cStack_61 = (char)(uVar4 >> 0x28);
      hdr.header[0] = (char)(uVar4 >> 0x20);
      hdr.header._1_4_ =
           (uint)(uVar4 >> 0x18) & 0xff | (uint)(uVar4 >> 8) & 0xff00 |
           (uint)(((uVar4 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar4 << 0x38) >> 0x20);
      cStack_63 = (char)(uVar4 >> 0x38);
      v[1].iov_base = (void *)0xd;
    }
  }
  v[0].iov_len = (size_t)&uStack_68;
  local_118 = 0x2382;
  if ((uint)ulen < 0x20) {
    v[3].iov_len = (size_t)auStack_115;
    local_116 = (byte)ulen | 0xa0;
    v[2].iov_base = (void *)0x3;
  }
  else if ((uint)ulen < 0x100) {
    v[3].iov_len = (long)auStack_115 + 1;
    local_116 = 0xd9;
    _auStack_115 = CONCAT31(stack0xfffffffffffffeec,(byte)ulen);
    v[2].iov_base = (void *)0x4;
  }
  else if ((uint)ulen < 0x10000) {
    v[3].iov_len = (long)auStack_115 + 2;
    local_116 = 0xda;
    _auStack_115 = CONCAT22(auStack_113._0_2_,(ushort)ulen << 8 | (ushort)ulen >> 8);
    v[2].iov_base = (void *)0x5;
  }
  else {
    v[3].iov_len = (long)auStack_113 + 2;
    local_116 = 0xdb;
    _auStack_115 = (uint)ulen >> 0x18 | (ulen & 0xff0000U) >> 8 | (ulen & 0xff00U) << 8 |
                   ulen << 0x18;
    v[2].iov_base = (void *)0x7;
  }
  v[1].iov_len = (size_t)&local_118;
  v[2].iov_len = (size_t)user;
  v[3].iov_base = (void *)(long)ulen;
  *(undefined1 *)((long)&local_118 + (long)v[2].iov_base) = 0x21;
  if (bVar8) {
    lVar3 = v[3].iov_len + 2;
    *(undefined1 *)(v[3].iov_len + 1) = 0x90;
    iVar1 = 5;
  }
  else {
    *(undefined2 *)(v[3].iov_len + 1) = 0xa992;
    *(undefined8 *)(v[3].iov_len + 3) = 0x6168732d70616863;
    *(undefined2 *)(v[3].iov_len + 0xb) = 0xb431;
    base64_decode(base64_salt,0x2c,(char *)local_208,0x40);
    context = (SHA1_CTX *)(hash2 + 0xc);
    SHA1Init(context);
    SHA1Update(context,(uchar *)pass,plen);
    SHA1Final(local_158,context);
    SHA1Init(context);
    SHA1Update(context,local_158,0x14);
    SHA1Final((uchar *)(salt + 0x38),context);
    SHA1Init(context);
    SHA1Update(context,local_208,0x14);
    SHA1Update(context,(uchar *)(salt + 0x38),0x14);
    SHA1Final(local_138,context);
    lVar3 = 0;
    do {
      local_138[lVar3] = local_138[lVar3] ^ local_158[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x14);
    lVar3 = v[3].iov_len + 0xd;
    v[4].iov_len = (size_t)local_138;
    v[5].iov_base = (void *)0x14;
    iVar1 = 6;
  }
  v[4].iov_base = (void *)(lVar3 - v[3].iov_len);
  uVar7 = 0x10;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(long *)((long)&v[0].iov_base + uVar7);
    uVar7 = uVar7 + 0x10;
  } while ((uint)(iVar1 << 4) != uVar7);
  if (uVar4 >> 0x20 == 0) {
    hash2[0xc] = 0xce;
    uVar2 = (uint)uVar4;
    stack0xfffffffffffffe4d =
         CONCAT44(stack0xfffffffffffffe51,
                  uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    v[0].iov_base = (void *)0x5;
  }
  else {
    hash2[0xc] = 0xcf;
    register0x00000000 =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    v[0].iov_base = (void *)0x9;
  }
  body._56_8_ = hash2 + 0xc;
  sVar5 = (*s->writev)(s,(iovec *)(body + 0x38),iVar1);
  return sVar5;
}

Assistant:

ssize_t
tnt_auth_raw(struct tnt_stream *s, const char *user, int ulen,
	     const char *pass, int plen, const char *base64_salt)
{
	struct tnt_iheader hdr;
	struct iovec v[6]; int v_sz = 5;
	char *data = NULL, *body_start = NULL;
	int guest = !user || (ulen == 5 && !strncmp(user, "guest", 5));
	if (guest) {
		user = "guest";
		ulen = 5;
	}
	encode_header(&hdr, TNT_OP_AUTH, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body; body_start = data;

	data = mp_encode_map(data, 2);
	data = mp_encode_uint(data, TNT_USERNAME);
	data = mp_encode_strl(data, ulen);
	v[2].iov_base = body_start;
	v[2].iov_len  = data - body_start;
	v[3].iov_base = (void *)user;
	v[3].iov_len  = ulen;
	body_start = data;
	data = mp_encode_uint(data, TNT_TUPLE);
	char salt[64], scramble[TNT_SCRAMBLE_SIZE];
	if (!guest) {
		data = mp_encode_array(data, 2);
		data = mp_encode_str(data, "chap-sha1", strlen("chap-sha1"));
		data = mp_encode_strl(data, TNT_SCRAMBLE_SIZE);
		base64_decode(base64_salt, TNT_SALT_SIZE, salt, 64);
		tnt_scramble_prepare(scramble, salt, pass, plen);
		v[5].iov_base = scramble;
		v[5].iov_len  = TNT_SCRAMBLE_SIZE;
		v_sz++;
	} else {
		data = mp_encode_array(data, 0);
	}
	v[4].iov_base = body_start;
	v[4].iov_len  = data - body_start;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i) {
		package_len += v[i].iov_len;
	}
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}